

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_popup_close(nk_context *ctx)

{
  byte *pbVar1;
  nk_window *pnVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x578c,"void nk_popup_close(struct nk_context *)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    if (pnVar2->parent == (nk_window *)0x0) {
      __assert_fail("popup->parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x5790,"void nk_popup_close(struct nk_context *)");
    }
    if ((pnVar2->layout->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) == 0) {
      __assert_fail("popup->layout->type & NK_PANEL_SET_POPUP",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x5791,"void nk_popup_close(struct nk_context *)");
    }
    pbVar1 = (byte *)((long)&pnVar2->flags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

NK_API void
nk_popup_close(struct nk_context *ctx)
{
    struct nk_window *popup;
    NK_ASSERT(ctx);
    if (!ctx || !ctx->current) return;

    popup = ctx->current;
    NK_ASSERT(popup->parent);
    NK_ASSERT(popup->layout->type & NK_PANEL_SET_POPUP);
    popup->flags |= NK_WINDOW_HIDDEN;
}